

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testIDManifest.cpp
# Opt level: O2

ostream * anon_unknown.dwarf_152b34::operator<<(ostream *out,IDManifest *mfst)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  _Rb_tree_node_base *p_Var4;
  ostream *poVar5;
  undefined8 *puVar6;
  _Rb_tree_node_base *p_Var7;
  bool bVar8;
  _Base_ptr p_Var9;
  string *psVar10;
  ulong uVar11;
  
  uVar11 = 0;
  while( true ) {
    uVar1 = Imf_3_4::IDManifest::size();
    if (uVar1 <= uVar11) break;
    lVar2 = Imf_3_4::IDManifest::operator[]((ulong)mfst);
    std::operator<<(out,"chans:");
    lVar3 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
    p_Var4 = *(_Rb_tree_node_base **)(lVar3 + 0x18);
    bVar8 = true;
    while( true ) {
      lVar3 = Imf_3_4::IDManifest::ChannelGroupManifest::getChannels_abi_cxx11_();
      if (p_Var4 == (_Rb_tree_node_base *)(lVar3 + 8)) break;
      if (!bVar8) {
        std::operator<<(out,',');
      }
      std::operator<<(out,(string *)(p_Var4 + 1));
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      bVar8 = false;
    }
    poVar5 = std::operator<<(out,"\nhash:");
    poVar5 = std::operator<<(poVar5,(string *)(lVar2 + 0x50));
    std::endl<char,std::char_traits<char>>(poVar5);
    poVar5 = std::operator<<(out,"encoding:");
    poVar5 = std::operator<<(poVar5,(string *)(lVar2 + 0x70));
    std::endl<char,std::char_traits<char>>(poVar5);
    if ((ulong)*(uint *)(lVar2 + 0x48) < 3) {
      std::operator<<(out,&DAT_0019f878 +
                          *(int *)(&DAT_0019f878 + (ulong)*(uint *)(lVar2 + 0x48) * 4));
    }
    std::operator<<(out,' ');
    puVar6 = (undefined8 *)Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
    psVar10 = (string *)*puVar6;
    while( true ) {
      lVar2 = Imf_3_4::IDManifest::ChannelGroupManifest::getComponents_abi_cxx11_();
      if (psVar10 == *(string **)(lVar2 + 8)) break;
      poVar5 = std::operator<<(out,';');
      std::operator<<(poVar5,psVar10);
      psVar10 = psVar10 + 0x20;
    }
    std::endl<char,std::char_traits<char>>(out);
    p_Var4 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::begin();
    while( true ) {
      p_Var7 = (_Rb_tree_node_base *)Imf_3_4::IDManifest::ChannelGroupManifest::end();
      if (p_Var4 == p_Var7) break;
      std::ostream::_M_insert<unsigned_long>((ulong)out);
      for (p_Var9 = p_Var4[1]._M_parent; p_Var9 != p_Var4[1]._M_left; p_Var9 = p_Var9 + 1) {
        poVar5 = std::operator<<(out,';');
        std::operator<<(poVar5,(string *)p_Var9);
      }
      std::operator<<(out,'\n');
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
    }
    uVar11 = uVar11 + 1;
  }
  return out;
}

Assistant:

std::ostream&
operator<< (std::ostream& out, const IDManifest& mfst)
{
    for (size_t i = 0; i < mfst.size (); ++i)
    {

        const IDManifest::ChannelGroupManifest& m     = mfst[i];
        bool                                    first = true;
        out << "chans:";
        for (set<string>::const_iterator s = m.getChannels ().begin ();
             s != m.getChannels ().end ();
             ++s)
        {
            if (!first) { out << ','; }
            else { first = false; }

            out << *s;
        }

        out << "\nhash:" << m.getHashScheme () << endl;
        out << "encoding:" << m.getEncodingScheme () << endl;
        switch (m.getLifetime ())
        {
            case IDManifest::LIFETIME_FRAME: out << "lifetime:frame\n"; break;
            case IDManifest::LIFETIME_SHOT: out << "lifetime:shot\n"; break;
            case IDManifest::LIFETIME_STABLE: out << "lifetime:stable\n"; break;
        }
        out << ' ';
        for (vector<string>::const_iterator c = m.getComponents ().begin ();
             c != m.getComponents ().end ();
             ++c)
        {
            out << ';' << *c;
        }
        out << endl;
        for (IDManifest::ChannelGroupManifest::ConstIterator q = m.begin ();
             q != m.end ();
             ++q)
        {
            out << q.id ();
            for (vector<string>::const_iterator c = q.text ().begin ();
                 c != q.text ().end ();
                 ++c)
            {
                out << ';' << *c;
            }
            out << '\n';
        }
    }
    return out;
}